

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ReduceProdLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reduceprod(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x4fb) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4fb;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    ReduceProdLayerParams::ReduceProdLayerParams(this_00.reduceprod_);
    (this->layer_).reduceprod_ = (ReduceProdLayerParams *)this_00;
  }
  return (ReduceProdLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceProdLayerParams* NeuralNetworkLayer::mutable_reduceprod() {
  if (!has_reduceprod()) {
    clear_layer();
    set_has_reduceprod();
    layer_.reduceprod_ = new ::CoreML::Specification::ReduceProdLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceProd)
  return layer_.reduceprod_;
}